

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::stmt_restorectx_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  long *plVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  string str;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->type_ == CUSTOM) {
    local_c8 = 0;
    local_c0 = local_c0 & 0xffffffffffffff00;
    iVar4 = ind + 1;
    local_d0 = &local_c0;
    while ((poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar1->target != DOT &&
           (iVar4 = iVar4 + -1, iVar4 != 0))) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(poVar1->yyrestorectx)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    uVar5 = local_c0;
    puVar6 = local_d0;
    if (local_d0 == &local_c0) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (this->type_ != DEFAULT) {
      return __return_storage_ptr__;
    }
    local_90 = (ulong *)&local_80;
    local_88 = 0;
    local_80 = 0;
    iVar4 = ind + 1;
    while ((poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar1->target != DOT &&
           (iVar4 = iVar4 + -1, iVar4 != 0))) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(poVar1->yycursor)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_c0 = *puVar6;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar6;
      local_d0 = (ulong *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(poVar1->yyctxmarker)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_90 == (ulong *)&local_80) {
      return __return_storage_ptr__;
    }
    uVar5 = CONCAT71(uStack_7f,local_80);
    puVar6 = local_90;
  }
  operator_delete(puVar6,uVar5 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_restorectx (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = indent (ind) + opts->yycursor + " = " + opts->yyctxmarker + ";\n";
			break;
		case CUSTOM:
			s = indent (ind) + opts->yyrestorectx + " ();\n";
			break;
	}
	return s;
}